

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,float *scaleFactors,int startPattern,int endPattern)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  long local_a8;
  
  uVar4 = this->kStateCount;
  uVar5 = this->kCategoryCount;
  iVar14 = uVar4 + 1;
  iVar6 = this->kPatternCount;
  iVar7 = this->kPartialsPaddedStateCount;
  lVar21 = (long)iVar7;
  iVar8 = this->kMatrixSize;
  local_c8 = matrices1 + 3;
  local_c0 = matrices2 + 3;
  iVar10 = startPattern * iVar7;
  local_b8 = matrices1;
  local_b0 = matrices2;
  for (uVar17 = 0; uVar17 != (~((int)uVar5 >> 0x1f) & uVar5); uVar17 = uVar17 + 1) {
    local_a8 = 0;
    pfVar15 = destP + (iVar6 * (int)uVar17 + startPattern) * iVar7;
    pfVar11 = partials2 + iVar10;
    pfVar12 = partials1 + iVar10;
    for (lVar19 = (long)startPattern; lVar19 < endPattern; lVar19 = lVar19 + 1) {
      fVar1 = scaleFactors[lVar19];
      pfVar13 = local_c8;
      pfVar18 = local_b0;
      pfVar22 = local_b8;
      pfVar24 = local_c0;
      for (uVar20 = 0; uVar20 != (~((int)uVar4 >> 0x1f) & uVar4); uVar20 = uVar20 + 1) {
        auVar26 = ZEXT816(0) << 0x40;
        lVar16 = 0;
        pfVar9 = pfVar22;
        pfVar23 = pfVar18;
        lVar25 = local_a8;
        while (lVar16 < (int)uVar4 / 4 << 2) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(pfVar13 + lVar16 + -3);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(pfVar12 + lVar16);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(pfVar13 + lVar16 + -1);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(pfVar12 + lVar16 + 2);
          lVar25 = lVar25 + 0x10;
          pfVar23 = pfVar23 + 4;
          pfVar9 = pfVar9 + 4;
          auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)pfVar24[lVar16 + -3]),0x20);
          auVar29 = vinsertps_avx(auVar29,ZEXT416((uint)pfVar11[lVar16]),0x20);
          auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)pfVar24[lVar16 + -2]),0x30);
          auVar29 = vinsertps_avx(auVar29,ZEXT416((uint)pfVar11[lVar16 + 1]),0x30);
          auVar29 = vfmadd213ps_fma(auVar29,auVar27,auVar26);
          auVar26 = vinsertps_avx(auVar28,ZEXT416((uint)pfVar24[lVar16 + -1]),0x20);
          auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)pfVar24[lVar16]),0x30);
          auVar27 = vinsertps_avx(auVar30,ZEXT416((uint)pfVar11[lVar16 + 2]),0x20);
          auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)pfVar11[lVar16 + 3]),0x30);
          lVar16 = lVar16 + 4;
          auVar26 = vfmadd213ps_fma(auVar27,auVar26,auVar29);
        }
        auVar27 = vshufpd_avx(auVar26,auVar26,1);
        auVar29 = auVar26;
        while (lVar16 < (int)uVar4) {
          fVar2 = *pfVar9;
          fVar3 = *pfVar23;
          lVar16 = lVar16 + 1;
          pfVar23 = pfVar23 + 1;
          pfVar9 = pfVar9 + 1;
          auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar2),
                                    ZEXT416(*(uint *)((long)(partials1 + iVar10) + lVar25)));
          auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar3),
                                    ZEXT416(*(uint *)((long)(partials2 + iVar10) + lVar25)));
          lVar25 = lVar25 + 4;
        }
        auVar28 = vmovshdup_avx(auVar26);
        auVar26 = vshufps_avx(auVar26,auVar26,0xff);
        pfVar24 = pfVar24 + iVar14;
        pfVar13 = pfVar13 + iVar14;
        pfVar18 = pfVar18 + iVar14;
        pfVar22 = pfVar22 + iVar14;
        *pfVar15 = (1.0 / fVar1) * (auVar28._0_4_ + auVar29._0_4_) * (auVar26._0_4_ + auVar27._0_4_)
        ;
        pfVar15 = pfVar15 + 1;
      }
      local_a8 = local_a8 + lVar21 * 4;
      pfVar11 = pfVar11 + lVar21;
      pfVar12 = pfVar12 + lVar21;
    }
    iVar10 = iVar10 + iVar6 * iVar7;
    local_c0 = local_c0 + iVar8;
    local_c8 = local_c8 + iVar8;
    local_b0 = local_b0 + iVar8;
    local_b8 = local_b8 + iVar8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}